

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::UpdateAlphas(Alice *this)

{
  int iVar1;
  long lVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  int local_18;
  int local_14;
  int i_1;
  int i;
  Alice *this_local;
  
  for (local_14 = 0; local_14 < (this->super_Party).n_p; local_14 = local_14 + 1) {
    iVar1 = (this->super_Party).alpha_rc;
    (this->super_Party).alpha_rc = iVar1 + 1;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       (&(this->super_Party).AlphaRandoms,(long)iVar1);
    lVar2 = *pvVar3;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).P,(long)local_14);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,4);
    *pvVar3 = local_14 + lVar2;
    iVar1 = (this->super_Party).alpha_rc;
    sVar5 = std::vector<long,_std::allocator<long>_>::size(&(this->super_Party).AlphaRandoms);
    (this->super_Party).alpha_rc = (int)((ulong)(long)iVar1 % sVar5);
  }
  for (local_18 = 0; local_18 < (this->super_Party).n_d; local_18 = local_18 + 1) {
    iVar1 = (this->super_Party).alpha_rc;
    (this->super_Party).alpha_rc = iVar1 + 1;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       (&(this->super_Party).AlphaRandoms,(long)iVar1);
    lVar2 = *pvVar3;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).D,(long)local_18);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,1);
    *pvVar3 = local_18 + lVar2;
    iVar1 = (this->super_Party).alpha_rc;
    sVar5 = std::vector<long,_std::allocator<long>_>::size(&(this->super_Party).AlphaRandoms);
    (this->super_Party).alpha_rc = (int)((ulong)(long)iVar1 % sVar5);
  }
  return;
}

Assistant:

void Alice::UpdateAlphas()
{
    for(int i = 0; i < n_p; i++)
    {
        P[i][4] = i + AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size();
    }
    for(int i = 0; i < n_d; i++)
    {
        D[i][1] = i + AlphaRandoms[alpha_rc++];
        alpha_rc = alpha_rc % AlphaRandoms.size(); 
    }  
}